

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_mxu__pool06(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  uint32_t uVar1;
  uint32_t opcode;
  DisasContext_conflict4 *ctx_local;
  CPUMIPSState_conflict2 *env_local;
  
  uVar1 = extract32(ctx->opcode,10,4);
  if (uVar1 == 0) {
    generate_exception_end(ctx,0x14);
  }
  else if (uVar1 == 1) {
    generate_exception_end(ctx,0x14);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void decode_opc_mxu__pool06(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opcode = extract32(ctx->opcode, 10, 4);

    switch (opcode) {
    case OPC_MXU_S32LDDV:
        /* TODO: Implement emulation of S32LDDV instruction. */
        MIPS_INVAL("OPC_MXU_S32LDDV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_S32LDDVR:
        /* TODO: Implement emulation of S32LDDVR instruction. */
        MIPS_INVAL("OPC_MXU_S32LDDVR");
        generate_exception_end(ctx, EXCP_RI);
        break;
    default:
        MIPS_INVAL("decode_opc_mxu");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}